

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O1

void __thiscall
flatbuffers::vector_downward<unsigned_int>::reallocate
          (vector_downward<unsigned_int> *this,size_t len)

{
  uint uVar1;
  ulong old_size;
  Allocator *pAVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  Allocator local_28;
  
  old_size = this->reserved_;
  uVar1 = this->size_;
  puVar4 = this->buf_;
  if (old_size == 0) {
    uVar5 = this->initial_size_;
  }
  else {
    uVar5 = old_size >> 1;
  }
  uVar6 = (long)this->scratch_ - (long)puVar4;
  if (len < uVar5) {
    len = uVar5;
  }
  pAVar2 = this->allocator_;
  uVar5 = -this->buffer_minalign_ & (len + old_size + this->buffer_minalign_) - 1;
  this->reserved_ = uVar5;
  if (puVar4 == (uint8_t *)0x0) {
    if (pAVar2 == (Allocator *)0x0) {
      puVar4 = (uint8_t *)operator_new__(uVar5);
    }
    else {
      iVar3 = (*pAVar2->_vptr_Allocator[2])(pAVar2,uVar5);
      puVar4 = (uint8_t *)CONCAT44(extraout_var_00,iVar3);
    }
  }
  else if (pAVar2 == (Allocator *)0x0) {
    local_28._vptr_Allocator = (_func_int **)&PTR__Allocator_0016ebf8;
    puVar4 = Allocator::reallocate_downward
                       (&local_28,puVar4,old_size,uVar5,(ulong)uVar1,uVar6 & 0xffffffff);
  }
  else {
    iVar3 = (*pAVar2->_vptr_Allocator[4])(pAVar2);
    puVar4 = (uint8_t *)CONCAT44(extraout_var,iVar3);
  }
  this->buf_ = puVar4;
  this->cur_ = puVar4 + (this->reserved_ - (ulong)uVar1);
  this->scratch_ = puVar4 + (uVar6 & 0xffffffff);
  return;
}

Assistant:

void reallocate(size_t len) {
    auto old_reserved = reserved_;
    auto old_size = size();
    auto old_scratch_size = scratch_size();
    reserved_ +=
        (std::max)(len, old_reserved ? old_reserved / 2 : initial_size_);
    reserved_ = (reserved_ + buffer_minalign_ - 1) & ~(buffer_minalign_ - 1);
    if (buf_) {
      buf_ = ReallocateDownward(allocator_, buf_, old_reserved, reserved_,
                                old_size, old_scratch_size);
    } else {
      buf_ = Allocate(allocator_, reserved_);
    }
    cur_ = buf_ + reserved_ - old_size;
    scratch_ = buf_ + old_scratch_size;
  }